

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdAddConfidentialTxIn
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,uint32_t sequence,
              char **tx_string)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  ConfidentialTransactionController ctxc;
  allocator local_221;
  string local_220;
  ConfidentialTransactionController local_200;
  string local_1b0;
  ConfidentialTxInReference local_190;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_200.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x5e1cf2;
    local_200.super_AbstractTransactionController.tx_address_._0_4_ = 0xcc;
    local_200.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5e1d2f;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_200,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_200.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&local_200.transaction_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_200);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (!bVar1) {
    if (tx_string != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_220,tx_hex_string,(allocator *)&local_1b0);
      cfd::ConfidentialTransactionController::ConfidentialTransactionController
                (&local_200,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      std::__cxx11::string::string((string *)&local_1b0,txid,&local_221);
      cfd::core::Txid::Txid((Txid *)&local_220,&local_1b0);
      cfd::ConfidentialTransactionController::AddTxIn
                (&local_190,&local_200,(Txid *)&local_220,vout,sequence);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
      local_220._M_dataplus._M_p = (pointer)&PTR__Txid_00723450;
      if ((void *)local_220._M_string_length != (void *)0x0) {
        operator_delete((void *)local_220._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      cfd::AbstractTransactionController::GetHex_abi_cxx11_
                (&local_220,&local_200.super_AbstractTransactionController);
      pcVar2 = cfd::capi::CreateString(&local_220);
      *tx_string = pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      local_200.super_AbstractTransactionController._vptr_AbstractTransactionController =
           (_func_int **)&PTR__ConfidentialTransactionController_007233d8;
      cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_200.transaction_);
      return 0;
    }
    local_200.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x5e1cf2;
    local_200.super_AbstractTransactionController.tx_address_._0_4_ = 0xd8;
    local_200.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5e1d2f;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_200,kCfdLogLevelWarning,"tx output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_200.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&local_200.transaction_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,"Failed to parameter. tx output is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_200);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_200.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)0x5e1cf2;
  local_200.super_AbstractTransactionController.tx_address_._0_4_ = 0xd2;
  local_200.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x5e1d2f;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_200,kCfdLogLevelWarning,"txid is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_200.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&local_200.transaction_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,"Failed to parameter. txid is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_200);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddConfidentialTxIn(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    uint32_t sequence, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    ctxc.AddTxIn(Txid(txid), vout, sequence);
    *tx_string = CreateString(ctxc.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}